

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O0

pair<_f0276eba_> __thiscall
cppcms::impl::details::basic_map<$7159f324$>::insert(basic_map<_7159f324_> *this,value_type *entry)

{
  container *p_00;
  iterator after_me;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar1;
  basic_map<_7159f324_> *in_RSI;
  value_type *in_RDI;
  pair<_f0276eba_> pVar2;
  iterator p;
  range_type *range;
  pair<_f0276eba_> r;
  basic_map<_7159f324_> *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd0;
  bool bVar3;
  container *this_00;
  value_type *v;
  container *in_stack_fffffffffffffff0;
  bool local_8;
  
  this_00 = (container *)0x0;
  bVar3 = false;
  v = in_RDI;
  std::pair<$f0276eba$>::pair<_a0b29c3c_>
            ((pair<_f0276eba_> *)&stack0xfffffffffffffff0,(container **)&stack0xffffffffffffffd8,
             (bool *)&stack0xffffffffffffffd7);
  rehash_if_needed(in_stack_ffffffffffffffc0);
  p_00 = (container *)
         basic_map<std::__cxx11::string,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>>>>
         ::get<std::__cxx11::string>
                   (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this_00);
  after_me = basic_map<std::__cxx11::string,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>>>>
             ::find_in_range<std::__cxx11::string>
                       ((basic_map<_7159f324_> *)this_00,
                        (range_type *)CONCAT17(bVar3,in_stack_ffffffffffffffd0),
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_00);
  uVar1 = extraout_RDX;
  if (after_me == (iterator)0x0) {
    after_me = allocate((basic_map<_7159f324_> *)in_stack_fffffffffffffff0,v);
    if ((p_00->val).first._M_string_length == 0) {
      intrusive_list<$b487a5d2$>::push_back
                ((intrusive_list<_b487a5d2_> *)((long)&(in_RDI->first).field_2 + 8),after_me);
      (p_00->val).first._M_string_length = (size_type)after_me;
      *(iterator *)&(p_00->val).first = after_me;
      uVar1 = extraout_RDX_00;
    }
    else {
      intrusive_list<$b487a5d2$>::insert_after
                ((intrusive_list<_b487a5d2_> *)CONCAT17(bVar3,in_stack_ffffffffffffffd0),p_00,
                 after_me);
      (p_00->val).first._M_string_length = (size_type)after_me;
      uVar1 = extraout_RDX_01;
    }
    local_8 = true;
    (in_RDI->second).
    super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         (_List_node_base *)
         ((long)&((in_RDI->second).
                  super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
                  ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
  }
  pVar2._9_7_ = (undefined7)((ulong)uVar1 >> 8);
  pVar2.second = local_8;
  pVar2.first = after_me;
  return pVar2;
}

Assistant:

std::pair<iterator,bool> insert(value_type const &entry)
	{
		std::pair<iterator,bool> r(iterator(),false);
		rehash_if_needed();
		range_type &range=get(entry.first);
		iterator p = find_in_range(range,entry.first);
		if(p) {
			r.first = p;
			return r;
		}
		p = allocate(entry);
		if(range.second == 0) {
			list_.push_back(p);
			range.first = range.second = p;
		}
		else {
			list_.insert_after(p,range.second);
			range.second = p;
		}

		r.first = p;
		r.second  = true;
		size_ ++;
		return r;
	}